

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O0

void * cmime_list_pop_head(CMimeList_T *list)

{
  int iVar1;
  CMimeList_T *pCStack_20;
  int ret;
  void *data;
  CMimeList_T *list_local;
  
  data = list;
  if (list != (CMimeList_T *)0x0) {
    iVar1 = cmime_list_remove(list,list->head,&stack0xffffffffffffffe0);
    if (iVar1 == 0) {
      list_local = pCStack_20;
    }
    else {
      list_local = (CMimeList_T *)0x0;
    }
    return list_local;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                ,0x75,"void *cmime_list_pop_head(CMimeList_T *)");
}

Assistant:

void *cmime_list_pop_head(CMimeList_T *list) {
    void *data;
    int ret;
 
    assert(list);
    
    ret = cmime_list_remove(list,cmime_list_head(list),&data);
 
    if(ret == 0) {
        return(data);
    } else {
        return(NULL);
    }
}